

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

int nettlp_msg_socket(in_addr addr)

{
  int __fd;
  int iVar1;
  sockaddr_in saddr;
  undefined1 local_28 [8];
  char acStack_20 [16];
  
  __fd = socket(2,2,0x11);
  if (-1 < __fd) {
    acStack_20[0] = '\0';
    acStack_20[1] = '\0';
    acStack_20[2] = '\0';
    acStack_20[3] = '\0';
    acStack_20[4] = '\0';
    acStack_20[5] = '\0';
    acStack_20[6] = '\0';
    acStack_20[7] = '\0';
    local_28._4_4_ = addr.s_addr;
    local_28._0_4_ = 0xff2f0002;
    iVar1 = connect(__fd,(sockaddr *)local_28,0x10);
    if (iVar1 < 0) {
      __fd = iVar1;
    }
  }
  return __fd;
}

Assistant:

static int nettlp_msg_socket(struct in_addr addr)
{
	int fd, ret;
	struct sockaddr_in saddr;

	fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (fd < 0)
		return fd;

	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr = addr;
	saddr.sin_port = htons(NETTLP_MSG_PORT);
	ret = connect(fd, (struct sockaddr *)&saddr, sizeof(saddr));
	if (ret < 0)
		return ret;

	return fd;
}